

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O2

Var Js::BoundFunction::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  FunctionInfo *pFVar9;
  Recycler *this;
  Type this_00;
  Var pvVar10;
  JavascriptMethod entryPoint;
  Type instance;
  uint uVar11;
  ThreadContext *pTVar12;
  ulong uVar13;
  RecyclableObject *obj;
  long lVar14;
  uint uVar15;
  ScriptContext *scriptContext;
  uint in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined1 local_b8 [8];
  TrackAllocData data;
  CallInfo local_80;
  Type TStack_78;
  RecyclableObject *local_70;
  CallInfo local_68;
  ScriptContext *local_60;
  CallInfo local_58;
  undefined1 local_50 [8];
  Arguments args;
  
  uVar15 = callInfo._0_4_;
  if (in_stack_00000010 != uVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x67,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a05408;
    *puVar8 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_50 = (undefined1  [8])callInfo;
  if (((ulong)callInfo & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  obj = (RecyclableObject *)
        function[3].super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject;
  if ((uVar15 >> 0x18 & 1) == 0) {
    args.Values = (Type)0x0;
  }
  else if ((uVar15 >> 0x1e & 1) == 0) {
    bVar3 = VarIsImpl<Js::JavascriptProxy>(obj);
    if (bVar3) {
      in_stack_00000018 = 0;
      args.Values = (Type)0x0;
    }
    else {
      pTVar12 = scriptContext->threadContext;
      bVar3 = pTVar12->reentrancySafeOrHandled;
      pTVar12->reentrancySafeOrHandled = true;
      args.Values = (Type)JavascriptOperators::NewScObjectNoCtor(obj,scriptContext);
LAB_00a05152:
      *(Type *)args.Info = args.Values;
      pTVar12->reentrancySafeOrHandled = bVar3;
    }
  }
  else {
    pvVar10 = Arguments::GetNewTarget((Arguments *)local_50);
    bVar3 = JavascriptOperators::IsConstructor(pvVar10);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                  ,0x7d,"(JavascriptOperators::IsConstructor(newTargetVar))",
                                  "newTarget must be a constructor");
      if (!bVar3) goto LAB_00a05408;
      *puVar8 = 0;
    }
    args.Values = (Type)UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    pFVar9 = JavascriptOperators::GetConstructorFunctionInfo(obj,scriptContext);
    if ((pFVar9 == (FunctionInfo *)0x0) || ((pFVar9->attributes & ClassConstructor) == None)) {
      pTVar12 = scriptContext->threadContext;
      bVar3 = pTVar12->reentrancySafeOrHandled;
      pTVar12->reentrancySafeOrHandled = true;
      args.Values = (Type)JavascriptOperators::CreateFromConstructor
                                    ((RecyclableObject *)args.Values,scriptContext);
      goto LAB_00a05152;
    }
    *(Type *)args.Info = args.Values;
  }
  auVar2 = local_50;
  local_80 = (CallInfo)local_50;
  TStack_78 = args.Info;
  uVar5 = *(uint32 *)
           &function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject;
  if (uVar5 == 0) {
    if ((uVar15 >> 0x18 & 1) == 0) {
      *(Type **)args.Info = function[3].type.ptr;
    }
  }
  else {
    local_70 = obj;
    uVar4 = CallInfo::GetLargeArgCountWithExtraArgs((CallInfo *)local_50);
    uVar5 = UInt32Math::Add(uVar5,uVar4);
    if (0xffffff < uVar5) {
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec52,(PCWSTR)0x0);
    }
    local_b8 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_5de7879;
    data.filename._0_4_ = 0xb0;
    data.plusSize = (ulong)uVar5;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_b8);
    this_00 = (Type)Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                              ((Memory *)this,(Recycler *)Memory::Recycler::Alloc,0,(ulong)uVar5);
    local_68 = callInfo;
    local_60 = scriptContext;
    if ((uVar15 >> 0x18 & 1) == 0) {
      Memory::WriteBarrierPtr<void>::operator=
                ((WriteBarrierPtr<void> *)this_00,(WriteBarrierPtr<void> *)&function[3].type);
    }
    else {
      pvVar10 = Arguments::operator[]((Arguments *)local_50,0);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet((WriteBarrierPtr<void> *)this_00,pvVar10);
    }
    local_58 = (CallInfo)auVar2;
    lVar14 = 0;
    uVar13 = 0;
    while (uVar13 < *(uint *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                              _vptr_IRecyclerVisitedObject) {
      uVar13 = uVar13 + 1;
      Memory::WriteBarrierPtr<void>::operator=
                ((WriteBarrierPtr<void> *)((uVar13 & 0xffffffff) * 8 + (long)this_00),
                 (WriteBarrierPtr<void> *)((long)&(function[4].type.ptr)->typeId + lVar14));
      lVar14 = lVar14 + 8;
    }
    uVar15 = 1;
    uVar11 = (uint)uVar13;
    while( true ) {
      uVar4 = uVar11 + 1;
      uVar13 = (ulong)uVar4;
      if ((auVar2._0_4_ & 0xffffff) <= uVar15) break;
      pvVar10 = Arguments::operator[]((Arguments *)local_50,uVar15);
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                ((WriteBarrierPtr<void> *)(uVar13 * 8 + (long)this_00),pvVar10);
      uVar15 = uVar15 + 1;
      uVar11 = uVar4;
    }
    bVar3 = CallInfo::HasExtraArg((CallInfo *)local_50);
    uVar15 = local_58._0_4_;
    if (bVar3) {
      uVar4 = uVar11 + 2;
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                ((WriteBarrierPtr<void> *)(uVar13 * 8 + (long)this_00),
                 *(void **)((long)args.Info + (ulong)(uVar15 & 0xffffff) * 8));
    }
    scriptContext = local_60;
    callInfo = local_68;
    local_80 = (CallInfo)
               ((ulong)local_50 & 0xffffffffff000000 |
               (ulong)(*(int *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject + uVar15 & 0xffffff));
    TStack_78 = this_00;
    uVar6 = CallInfo::GetLargeArgCountWithExtraArgs(&local_80);
    obj = local_70;
    if (uVar4 != uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                  ,0xd3,"(index == actualArgs.GetLargeArgCountWithExtraArgs())",
                                  "index == actualArgs.GetLargeArgCountWithExtraArgs()");
      if (!bVar3) {
LAB_00a05408:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
  }
  pTVar12 = scriptContext->threadContext;
  bVar3 = pTVar12->reentrancySafeOrHandled;
  pTVar12->reentrancySafeOrHandled = true;
  entryPoint = RecyclableObject::GetEntryPoint(obj);
  data._32_8_ = local_80;
  instance = (Type)JavascriptFunction::CallFunction<true>
                             (obj,entryPoint,(Arguments *)&data.line,true);
  pTVar12->reentrancySafeOrHandled = bVar3;
  if (((callInfo._0_4_ >> 0x18 & 1) != 0) &&
     (BVar7 = JavascriptOperators::IsObject(instance), BVar7 == 0)) {
    instance = args.Values;
  }
  return instance;
}

Assistant:

Var BoundFunction::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction /* TODO-ERROR: get arg name - args[0] */);
        }

        BoundFunction *boundFunction = (BoundFunction *) function;
        RecyclableObject *targetFunction = boundFunction->targetFunction;

        //
        // var o = new boundFunction()
        // a new object should be created using the actual function object
        //
        Var newVarInstance = nullptr;
        if (callInfo.Flags & CallFlags_New)
        {
            if (args.HasNewTarget())
            {
                // target has an overridden new target make a new object from the newTarget
                Var newTargetVar = args.GetNewTarget();
                AssertOrFailFastMsg(JavascriptOperators::IsConstructor(newTargetVar), "newTarget must be a constructor");
                RecyclableObject* newTarget = UnsafeVarTo<RecyclableObject>(newTargetVar);

                // Class constructors expect newTarget to be in args slot 0 (usually "this"),
                // because "this" is not constructed until we reach the most-super superclass.
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetFunction, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    args.Values[0] = newVarInstance = newTarget;
                }
                else
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        args.Values[0] = newVarInstance = JavascriptOperators::CreateFromConstructor(newTarget, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
            else if (!VarIs<JavascriptProxy>(targetFunction))
            {
                // No new target and target is not a proxy can make a new object in a "normal" way.
                // NewScObjectNoCtor will either construct an object or return targetFunction depending
                // on whether targetFunction is a class constructor.
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    args.Values[0] = newVarInstance = JavascriptOperators::NewScObjectNoCtor(targetFunction, scriptContext);
                }
                END_SAFE_REENTRANT_CALL
            }
            else
            {
                // target is a proxy without an overridden new target
                // give nullptr - FunctionCallTrap will make a new object
                args.Values[0] = newVarInstance;
            }
        }

        Js::Arguments actualArgs = args;

        if (boundFunction->count > 0)
        {
            // OACR thinks that this can change between here and the check in the for loop below
            const unsigned int argCount = args.Info.Count;

            uint32 newArgCount = UInt32Math::Add(boundFunction->count, args.GetLargeArgCountWithExtraArgs());
            if (newArgCount > CallInfo::kMaxCountArgs)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            Field(Var) *newValues = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), newArgCount);
            uint index = 0;

            //
            // For [[Construct]] use the newly created var instance
            // For [[Call]] use the "this" to which bind bound it.
            //
            if (callInfo.Flags & CallFlags_New)
            {
                newValues[index++] = args[0];
            }
            else
            {
                newValues[index++] = boundFunction->boundThis;
            }

            for (uint i = 0; i < boundFunction->count; i++)
            {
                newValues[index++] = boundFunction->boundArgs[i];
            }

            // Copy the extra args
            for (uint i=1; i<argCount; i++)
            {
                newValues[index++] = args[i];
            }

            if (args.HasExtraArg())
            {
                newValues[index++] = args.Values[argCount];
            }

            actualArgs = Arguments(args.Info, unsafe_write_barrier_cast<Var*>(newValues));
            actualArgs.Info.Count = boundFunction->count + argCount;

            Assert(index == actualArgs.GetLargeArgCountWithExtraArgs());
        }
        else
        {
            if (!(callInfo.Flags & CallFlags_New))
            {
                actualArgs.Values[0] = boundFunction->boundThis;
            }
        }

        Var aReturnValue = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the larger argcount logic for this call.
            aReturnValue = JavascriptFunction::CallFunction<true>(targetFunction, targetFunction->GetEntryPoint(), actualArgs, /* useLargeArgCount */ true);
        }
        END_SAFE_REENTRANT_CALL

        //
        // [[Construct]] and call returned a non-object
        // return the newly created var instance
        //
        if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
        {
            aReturnValue = newVarInstance;
        }

        return aReturnValue;
    }